

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

void __thiscall KMaxDistance::copyVals(KMaxDistance *this,MaxRec *src,MaxRec *dst)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  double dVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint extraout_EDX;
  double *pdVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double in_XMM0_Qa;
  
  uVar1 = src->numVals;
  if (uVar1 == dst->numVals) {
    if (0 < (int)uVar1) {
      uVar17 = 0;
      do {
        dst->vals[uVar17] = src->vals[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar1 != uVar17);
    }
    dst->sumVals = src->sumVals;
    return;
  }
  copyVals();
  if ((src->vals[(long)(int)extraout_EDX + -8] < in_XMM0_Qa) && (0 < (int)extraout_EDX)) {
    uVar17 = (ulong)extraout_EDX;
    if (in_XMM0_Qa <= (double)src->next) {
      uVar20 = 1;
      do {
        uVar18 = uVar20;
        if (uVar17 == uVar18) {
          return;
        }
        uVar20 = uVar18 + 1;
      } while (in_XMM0_Qa <= src->vals[uVar18 - 7]);
    }
    else {
      uVar18 = 0;
    }
    if ((int)uVar18 < (int)(extraout_EDX - 1)) {
      uVar20 = uVar17 - 2;
      if ((long)uVar18 < (long)(uVar17 - 2)) {
        uVar20 = uVar18;
      }
      pdVar19 = src[-1].vals + (uVar17 - 7);
      auVar22 = vpbroadcastq_avx512f();
      uVar21 = 0;
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x1020304050607));
      auVar22 = vpermq_avx512f(auVar24,auVar22);
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar25 = vporq_avx512f(auVar25,auVar23);
        auVar25 = vpermq_avx512f(auVar24,auVar25);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar22,2);
        dVar10 = *pdVar19;
        lVar11 = (long)pdVar19[1];
        lVar12 = (long)pdVar19[2];
        lVar13 = (long)pdVar19[3];
        lVar14 = (long)pdVar19[4];
        lVar15 = (long)pdVar19[5];
        lVar16 = (long)pdVar19[6];
        bVar2 = (bool)((byte)uVar9 & 1);
        bVar3 = (bool)((byte)(uVar9 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar9 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar9 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar9 >> 6) & 1);
        *pdVar19 = (double)((ulong)bVar2 * (ulong)((byte)uVar9 & 1) * (long)pdVar19[-1] |
                           (ulong)!bVar2 * (long)*pdVar19);
        pdVar19[1] = (double)((ulong)bVar3 * (ulong)((byte)(uVar9 >> 1) & 1) * (long)dVar10 |
                             (ulong)!bVar3 * (long)pdVar19[1]);
        pdVar19[2] = (double)((ulong)bVar4 * (ulong)((byte)(uVar9 >> 2) & 1) * lVar11 |
                             (ulong)!bVar4 * (long)pdVar19[2]);
        pdVar19[3] = (double)((ulong)bVar5 * (ulong)((byte)(uVar9 >> 3) & 1) * lVar12 |
                             (ulong)!bVar5 * (long)pdVar19[3]);
        pdVar19[4] = (double)((ulong)bVar6 * (ulong)((byte)(uVar9 >> 4) & 1) * lVar13 |
                             (ulong)!bVar6 * (long)pdVar19[4]);
        pdVar19[5] = (double)((ulong)bVar7 * (ulong)((byte)(uVar9 >> 5) & 1) * lVar14 |
                             (ulong)!bVar7 * (long)pdVar19[5]);
        pdVar19[6] = (double)((ulong)bVar8 * (ulong)((byte)(uVar9 >> 6) & 1) * lVar15 |
                             (ulong)!bVar8 * (long)pdVar19[6]);
        pdVar19[7] = (double)((uVar9 >> 7) * (uVar9 >> 7) * lVar16 |
                             (ulong)!SUB81(uVar9 >> 7,0) * (long)pdVar19[7]);
        uVar21 = uVar21 + 8;
        pdVar19 = pdVar19 + -8;
      } while ((~uVar20 + 7 + uVar17 & 0xfffffffffffffff8) != uVar21);
    }
    src->vals[uVar18 - 7] = in_XMM0_Qa;
  }
  return;
}

Assistant:

void KMaxDistance::copyVals( const MaxRec *src, MaxRec *dst ){
    if ( src->numVals != dst->numVals ){ fprintf(stderr, "ERROR: size mismatch in copyVals.\n"); exit(1); }
    for ( int i = 0; i < src->numVals; ++i ) dst->vals[i] = src->vals[i];
    dst->sumVals = src->sumVals;
}